

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film.h
# Opt level: O3

RGB __thiscall
pbrt::GBufferFilm::ToOutputRGB(GBufferFilm *this,SampledSpectrum *L,SampledWavelengths *lambda)

{
  Float *pFVar1;
  undefined1 auVar2 [16];
  int iVar3;
  long lVar4;
  SquareMatrix<3> *pSVar5;
  Float *pFVar6;
  long lVar7;
  undefined1 in_ZMM0 [64];
  undefined1 auVar9 [56];
  undefined1 auVar10 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar12 [60];
  RGB RVar13;
  Float local_14;
  undefined8 local_10;
  undefined1 auVar8 [64];
  undefined1 auVar11 [64];
  
  auVar12 = in_ZMM1._4_60_;
  auVar9 = in_ZMM0._8_56_;
  RVar13 = PixelSensor::ToSensorRGB((this->super_FilmBase).sensor,L,lambda);
  auVar11._0_4_ = RVar13.b;
  auVar11._4_60_ = auVar12;
  auVar8._0_8_ = RVar13._0_8_;
  auVar8._8_56_ = auVar9;
  pSVar5 = &this->outputRGBFromSensorRGB;
  auVar2 = vmovshdup_avx(auVar8._0_16_);
  lVar4 = 0;
  local_10 = 0;
  local_14 = 0.0;
  do {
    iVar3 = (int)lVar4;
    pFVar6 = (Float *)&local_10;
    if ((iVar3 != 0) && (pFVar6 = (Float *)((long)&local_10 + 4), iVar3 != 1)) {
      pFVar6 = &local_14;
    }
    *pFVar6 = 0.0;
    lVar7 = 0;
    do {
      auVar10 = auVar8._0_16_;
      if (((int)lVar7 != 0) && (auVar10 = auVar2, (int)lVar7 != 1)) {
        auVar10 = auVar11._0_16_;
      }
      pFVar6 = (Float *)&local_10;
      if ((iVar3 != 0) && (pFVar6 = (Float *)((long)&local_10 + 4), iVar3 != 1)) {
        pFVar6 = &local_14;
      }
      pFVar1 = pSVar5->m[0] + lVar7;
      lVar7 = lVar7 + 1;
      auVar10 = vfmadd213ss_fma(auVar10,ZEXT416((uint)*pFVar1),ZEXT416((uint)*pFVar6));
      *pFVar6 = auVar10._0_4_;
    } while (lVar7 != 3);
    lVar4 = lVar4 + 1;
    pSVar5 = (SquareMatrix<3> *)(pSVar5->m + 1);
  } while (lVar4 != 3);
  RVar13.b = local_14;
  RVar13.r = (Float)(undefined4)local_10;
  RVar13.g = (Float)local_10._4_4_;
  return RVar13;
}

Assistant:

PBRT_CPU_GPU
    RGB ToOutputRGB(const SampledSpectrum &L, const SampledWavelengths &lambda) const {
        RGB cameraRGB = sensor->ToSensorRGB(L, lambda);
        return outputRGBFromSensorRGB * cameraRGB;
    }